

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall Board::Board(Board *this)

{
  initializer_list<Ship> __l;
  allocator<Ship> local_111;
  Ship local_110;
  Ship local_f8;
  Ship local_e0;
  Ship local_c8;
  Ship local_b0;
  Ship local_98;
  Ship local_80;
  Ship local_68;
  Ship local_50;
  Ship local_38;
  Ship *local_20;
  size_type local_18;
  Board *local_10;
  Board *this_local;
  
  local_10 = this;
  Ship::Ship(&local_110,'B',4);
  Ship::Ship(&local_f8,'D',3);
  Ship::Ship(&local_e0,'D',3);
  Ship::Ship(&local_c8,'C',2);
  Ship::Ship(&local_b0,'C',2);
  Ship::Ship(&local_98,'C',2);
  Ship::Ship(&local_80,'S',1);
  Ship::Ship(&local_68,'S',1);
  Ship::Ship(&local_50,'S',1);
  Ship::Ship(&local_38,'S',1);
  local_18 = 10;
  local_20 = &local_110;
  std::allocator<Ship>::allocator(&local_111);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::vector<Ship,_std::allocator<Ship>_>::vector(&this->armada,__l,&local_111);
  std::allocator<Ship>::~allocator(&local_111);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->matrix);
  this->row = 0;
  this->column = 0;
  return;
}

Assistant:

Board(void) 
        {
          row = 0;
          column = 0;
        }